

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Parameters *extraout_RDX;
  Unique<vk::Handle<(vk::HandleType)23>_> obj0;
  Unique<vk::Handle<(vk::HandleType)23>_> obj2;
  Unique<vk::Handle<(vk::HandleType)23>_> obj1;
  Unique<vk::Handle<(vk::HandleType)23>_> obj3;
  Environment env;
  Resources res;
  VkFramebuffer local_1f8;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_1f0;
  Move<vk::Handle<(vk::HandleType)23>_> local_1d8;
  Move<vk::Handle<(vk::HandleType)23>_> local_1b8;
  Move<vk::Handle<(vk::HandleType)23>_> local_198;
  Move<vk::Handle<(vk::HandleType)23>_> local_178;
  Environment local_158;
  Resources local_120;
  
  local_158.vkp = *(PlatformInterface **)(this + 8);
  local_158.vkd = Context::getDeviceInterface((Context *)this);
  local_158.device = Context::getDevice((Context *)this);
  local_158.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_158.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_158.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_158.maxResourceConsumers = 4;
  Framebuffer::Resources::Resources(&local_120,&local_158,extraout_RDX);
  Framebuffer::create(&local_1b8,&local_158,&local_120,param_4);
  DStack_1f0.m_device =
       local_1b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  DStack_1f0.m_allocator =
       local_1b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_1f8.m_internal =
       local_1b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  DStack_1f0.m_deviceIface =
       local_1b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  Framebuffer::create(&local_1d8,&local_158,&local_120,param_4);
  local_1b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  local_1b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_1b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_1b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       local_1d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  Framebuffer::create(&local_198,&local_158,&local_120,param_4);
  local_1d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  local_1d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_1d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_1d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  Framebuffer::create(&local_178,&local_158,&local_120,param_4);
  local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface =
       local_178.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  if (local_178.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&local_198.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               local_178.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (local_1d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&local_1d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               local_1d8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (local_1b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&local_1b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               (VkFramebuffer)
               local_1b8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal);
  }
  if (local_1f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_1f0,local_1f8);
  }
  local_1f8.m_internal = (deUint64)&DStack_1f0.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1f8.m_internal,
             (undefined1 *)
             ((long)&(DStack_1f0.m_deviceIface)->_vptr_DeviceInterface + local_1f8.m_internal));
  if ((VkDevice *)local_1f8.m_internal != &DStack_1f0.m_device) {
    operator_delete((void *)local_1f8.m_internal,(ulong)(DStack_1f0.m_device + 1));
  }
  Framebuffer::Resources::~Resources(&local_120);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}